

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_regexp(JSParseState *s)

{
  byte *pbVar1;
  JSParseState *pJVar2;
  int iVar3;
  byte *pbVar4;
  JSParseState *in_RDI;
  JSValue JVar5;
  uint8_t *p_next_2;
  uint8_t *p_next_1;
  uint8_t *p_next;
  uint32_t c;
  StringBuffer *b2;
  StringBuffer b2_s;
  StringBuffer *b;
  StringBuffer b_s;
  BOOL in_class;
  uint8_t *p;
  StringBuffer *in_stack_ffffffffffffff38;
  JSContext *in_stack_ffffffffffffff40;
  JSParseState *s_00;
  JSValueUnion local_b0;
  int64_t local_a8;
  JSValueUnion local_a0;
  int64_t local_98;
  byte *local_90;
  byte *local_88;
  byte *local_80;
  uint local_74;
  undefined1 *local_70;
  undefined1 local_68 [32];
  undefined1 *local_48;
  undefined1 local_40 [36];
  int local_1c;
  byte *local_18;
  JSParseState *local_10;
  
  local_48 = local_40;
  local_70 = local_68;
  local_18 = in_RDI->buf_ptr + 1;
  local_1c = 0;
  local_10 = in_RDI;
  iVar3 = string_buffer_init(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0);
  if (iVar3 != 0) {
    return -1;
  }
  iVar3 = string_buffer_init(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0);
  pbVar1 = local_18;
  while (local_18 = pbVar1, iVar3 == 0) {
    if (local_10->buf_end <= pbVar1) {
LAB_0019566c:
      js_parse_error(local_10,"unexpected end of regexp");
      break;
    }
    local_18 = pbVar1 + 1;
    local_74 = (uint)*pbVar1;
    if ((local_74 == 10) || (local_74 == 0xd)) {
LAB_00195857:
      js_parse_error(local_10,"unexpected line terminator in regexp");
      break;
    }
    if (local_74 == 0x2f) {
      if (local_1c == 0) goto LAB_001958a0;
    }
    else if (local_74 == 0x5b) {
      local_1c = 1;
    }
    else if (local_74 == 0x5d) {
      local_1c = 0;
    }
    else if (local_74 == 0x5c) {
      iVar3 = string_buffer_putc8(in_stack_ffffffffffffff38,0);
      pbVar1 = local_18;
      if (iVar3 != 0) break;
      pbVar4 = local_18 + 1;
      local_74 = (uint)*local_18;
      local_18 = pbVar4;
      if ((local_74 == 10) || (local_74 == 0xd)) goto LAB_00195857;
      if ((local_74 == 0) && (local_10->buf_end <= pbVar4)) goto LAB_0019566c;
      if (0x7f < local_74) {
        local_74 = unicode_from_utf8(pbVar1,6,&local_80);
        pbVar1 = local_80;
        if (local_74 < 0x110000) goto joined_r0x00195849;
        goto LAB_00195819;
      }
    }
    else if (0x7f < local_74) {
      local_74 = unicode_from_utf8(pbVar1,6,&local_88);
      pbVar1 = local_88;
      if (0x10ffff < local_74) goto LAB_00195819;
joined_r0x00195849:
      local_18 = pbVar1;
      if ((local_74 == 0x2028) || (local_74 == 0x2029)) goto LAB_00195857;
    }
    iVar3 = string_buffer_putc(in_stack_ffffffffffffff38,0);
    pbVar1 = local_18;
  }
LAB_001959de:
  string_buffer_free((StringBuffer *)0x1959eb);
  string_buffer_free((StringBuffer *)0x1959f5);
  return -1;
LAB_001958a0:
  local_90 = local_18 + 1;
  local_74 = (uint)*local_18;
  if ((0x7f < local_74) && (local_74 = unicode_from_utf8(local_18,6,&local_90), 0x10ffff < local_74)
     ) goto LAB_00195819;
  iVar3 = lre_js_is_ident_next((int)in_stack_ffffffffffffff40);
  if (iVar3 == 0) {
    (local_10->token).val = -0x7c;
    s_00 = local_10;
    JVar5 = string_buffer_end((StringBuffer *)local_10);
    pJVar2 = local_10;
    local_a0 = JVar5.u;
    (s_00->token).u.str.str.u = local_a0;
    local_98 = JVar5.tag;
    (s_00->token).u.str.str.tag = local_98;
    JVar5 = string_buffer_end((StringBuffer *)s_00);
    local_b0 = JVar5.u;
    (pJVar2->token).u.regexp.flags.u = local_b0;
    local_a8 = JVar5.tag;
    (pJVar2->token).u.regexp.flags.tag = local_a8;
    local_10->buf_ptr = local_18;
    return 0;
  }
  iVar3 = string_buffer_putc(in_stack_ffffffffffffff38,0);
  if (iVar3 != 0) goto LAB_001959de;
  local_18 = local_90;
  goto LAB_001958a0;
LAB_00195819:
  js_parse_error(local_10,"invalid UTF-8 sequence");
  goto LAB_001959de;
}

Assistant:

static __exception int js_parse_regexp(JSParseState *s)
{
    const uint8_t *p;
    BOOL in_class;
    StringBuffer b_s, *b = &b_s;
    StringBuffer b2_s, *b2 = &b2_s;
    uint32_t c;

    p = s->buf_ptr;
    p++;
    in_class = FALSE;
    if (string_buffer_init(s->ctx, b, 32))
        return -1;
    if (string_buffer_init(s->ctx, b2, 1))
        goto fail;
    for(;;) {
        if (p >= s->buf_end) {
        eof_error:
            js_parse_error(s, "unexpected end of regexp");
            goto fail;
        }
        c = *p++;
        if (c == '\n' || c == '\r') {
            goto eol_error;
        } else if (c == '/') {
            if (!in_class)
                break;
        } else if (c == '[') {
            in_class = TRUE;
        } else if (c == ']') {
            /* XXX: incorrect as the first character in a class */
            in_class = FALSE;
        } else if (c == '\\') {
            if (string_buffer_putc8(b, c))
                goto fail;
            c = *p++;
            if (c == '\n' || c == '\r')
                goto eol_error;
            else if (c == '\0' && p >= s->buf_end)
                goto eof_error;
            else if (c >= 0x80) {
                const uint8_t *p_next;
                c = unicode_from_utf8(p - 1, UTF8_CHAR_LEN_MAX, &p_next);
                if (c > 0x10FFFF) {
                    goto invalid_utf8;
                }
                p = p_next;
                if (c == CP_LS || c == CP_PS)
                    goto eol_error;
            }
        } else if (c >= 0x80) {
            const uint8_t *p_next;
            c = unicode_from_utf8(p - 1, UTF8_CHAR_LEN_MAX, &p_next);
            if (c > 0x10FFFF) {
            invalid_utf8:
                js_parse_error(s, "invalid UTF-8 sequence");
                goto fail;
            }
            p = p_next;
            /* LS or PS are considered as line terminator */
            if (c == CP_LS || c == CP_PS) {
            eol_error:
                js_parse_error(s, "unexpected line terminator in regexp");
                goto fail;
            }
        }
        if (string_buffer_putc(b, c))
            goto fail;
    }

    /* flags */
    for(;;) {
        const uint8_t *p_next = p;
        c = *p_next++;
        if (c >= 0x80) {
            c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p_next);
            if (c > 0x10FFFF) {
                goto invalid_utf8;
            }
        }
        if (!lre_js_is_ident_next(c))
            break;
        if (string_buffer_putc(b2, c))
            goto fail;
        p = p_next;
    }

    s->token.val = TOK_REGEXP;
    s->token.u.regexp.body = string_buffer_end(b);
    s->token.u.regexp.flags = string_buffer_end(b2);
    s->buf_ptr = p;
    return 0;
 fail:
    string_buffer_free(b);
    string_buffer_free(b2);
    return -1;
}